

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalOperator::SetParamsEstimatedCardinality
          (LogicalOperator *this,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->has_estimated_cardinality == true) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"%llu","");
    Exception::ConstructMessage<unsigned_long>(&local_40,&local_60,this->estimated_cardinality);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"__estimated_cardinality__","");
    this_00 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](result,&local_80);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void LogicalOperator::SetParamsEstimatedCardinality(InsertionOrderPreservingMap<string> &result) const {
	if (has_estimated_cardinality) {
		result[RenderTreeNode::ESTIMATED_CARDINALITY] = StringUtil::Format("%llu", estimated_cardinality);
	}
}